

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O3

void __thiscall
capnp::anon_unknown_0::FakeFileReader::add(FakeFileReader *this,StringPtr name,StringPtr content)

{
  String *pSVar1;
  File *pFVar2;
  size_t sVar3;
  PathPtr path;
  Directory local_58;
  File *local_50;
  Path local_48;
  PathPtr local_30;
  
  pSVar1 = (String *)(this->root).ptr;
  local_30.parts.ptr = (this->cwd).parts.ptr;
  local_30.parts.size_ = (this->cwd).parts.size_;
  kj::PathPtr::eval(&local_48,&local_30,name);
  path.parts.size_ = (size_t)local_48.parts.ptr;
  path.parts.ptr = pSVar1;
  kj::Directory::openFile(&local_58,path,(WriteMode)local_48.parts.size_);
  kj::File::writeAll(local_50,content);
  pFVar2 = local_50;
  if (local_50 != (File *)0x0) {
    local_50 = (File *)0x0;
    (**(code **)*(_func_int **)local_58.super_ReadableDirectory.super_FsNode._vptr_FsNode)
              (local_58.super_ReadableDirectory.super_FsNode._vptr_FsNode,
               (pFVar2->super_ReadableFile).super_FsNode._vptr_FsNode[-2] +
               (long)&(pFVar2->super_ReadableFile).super_FsNode._vptr_FsNode);
  }
  sVar3 = local_48.parts.size_;
  pSVar1 = local_48.parts.ptr;
  if (local_48.parts.ptr != (String *)0x0) {
    local_48.parts.ptr = (String *)0x0;
    local_48.parts.size_ = 0;
    (**(local_48.parts.disposer)->_vptr_ArrayDisposer)
              (local_48.parts.disposer,pSVar1,0x18,sVar3,sVar3,
               kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return;
}

Assistant:

void add(kj::StringPtr name, kj::StringPtr content) {
    root->openFile(cwd.evalNative(name), kj::WriteMode::CREATE | kj::WriteMode::CREATE_PARENT)
        ->writeAll(content);
  }